

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

void build_sorted_tables(ecs_query_t *query)

{
  uint end;
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  
  ecs_vector_free(query->table_slices);
  query->table_slices = (ecs_vector_t *)0x0;
  end = ecs_vector_count(query->tables);
  pvVar2 = _ecs_vector_first(query->tables,0x50,0x10);
  if (0 < (int)end) {
    piVar5 = (int *)((long)pvVar2 + 0x48);
    uVar4 = 0;
    iVar1 = 0;
    uVar3 = 0;
    do {
      if ((iVar1 != *piVar5) && (iVar1 = *piVar5, uVar4 != uVar3)) {
        build_sorted_table_range(query,(int32_t)uVar3,(int32_t)uVar4);
        uVar3 = uVar4 & 0xffffffff;
        iVar1 = *piVar5;
      }
      uVar4 = uVar4 + 1;
      piVar5 = piVar5 + 0x14;
    } while (end != uVar4);
    if ((uint)uVar3 != end) {
      build_sorted_table_range(query,(uint)uVar3,end);
      return;
    }
  }
  return;
}

Assistant:

static
void build_sorted_tables(
    ecs_query_t *query)
{
    /* Clean previous sorted tables */
    ecs_vector_free(query->table_slices);
    query->table_slices = NULL;

    int32_t i, count = ecs_vector_count(query->tables);
    ecs_matched_table_t *tables = ecs_vector_first(query->tables, ecs_matched_table_t);
    ecs_matched_table_t *table = NULL;

    int32_t start = 0, rank = 0;
    for (i = 0; i < count; i ++) {
        table = &tables[i];
        if (rank != table->rank) {
            if (start != i) {
                build_sorted_table_range(query, start, i);
                start = i;
            }
            rank = table->rank;
        }
    }

    if (start != i) {
        build_sorted_table_range(query, start, i);
    }
}